

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_roi_utils.c
# Opt level: O0

MPP_RET gen_vepu580_roi_h264(MppEncRoiImpl *ctx)

{
  Vepu541RoiCfg *pVVar1;
  void *__s;
  void *__s_00;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Vepu541RoiCfg *pVVar5;
  ushort *puVar6;
  ulong *puVar7;
  Vepu580RoiH264BsCfg *base_cfg;
  Vepu580RoiQpCfg *qp_cfg;
  Vepu541RoiCfg *cu_cfg;
  RK_S32 k;
  RK_S32 j;
  Vepu580RoiH264BsCfg *dst_base;
  Vepu580RoiQpCfg *dst_qp;
  Vepu541RoiCfg *src;
  RK_S32 roi_qp_size;
  RK_S32 roi_buf_size;
  RK_S32 stride_v;
  RK_S32 stride_h;
  RK_S32 mb_h;
  RK_S32 mb_w;
  MppEncRoiImpl *ctx_local;
  
  iVar2 = (int)((long)((long)(ctx->h + 0xf) & 0xfffffffffffffff0U) / 0x10);
  uVar3 = (int)((long)((long)(ctx->w + 0xf) & 0xfffffffffffffff0U) / 0x10) + 3U & 0xfffffffc;
  uVar4 = iVar2 + 3U & 0xfffffffc;
  pVVar1 = ctx->tmp;
  __s = ctx->dst_qp;
  __s_00 = ctx->dst_base;
  if (((pVVar1 == (Vepu541RoiCfg *)0x0) || (__s == (void *)0x0)) || (__s_00 == (void *)0x0)) {
    ctx_local._4_4_ = MPP_NOK;
  }
  else {
    memset(__s_00,0,(long)(int)(uVar3 * uVar4 * 8));
    memset(__s,0,(long)(int)(uVar3 * uVar4 * 2));
    for (cu_cfg._4_4_ = 0; cu_cfg._4_4_ < iVar2; cu_cfg._4_4_ = cu_cfg._4_4_ + 1) {
      for (cu_cfg._0_4_ = 0; (int)cu_cfg < (int)uVar3; cu_cfg._0_4_ = (int)cu_cfg + 1) {
        if (ctx->cu_map[(int)(cu_cfg._4_4_ * uVar3 + (int)cu_cfg)] != '\0') {
          pVVar5 = pVVar1 + (int)(cu_cfg._4_4_ * uVar3 + (int)cu_cfg);
          puVar6 = (ushort *)((long)__s + (long)(int)(cu_cfg._4_4_ * uVar3 + (int)cu_cfg) * 2);
          puVar7 = (ulong *)((long)__s_00 + (long)(int)(cu_cfg._4_4_ * uVar3 + (int)cu_cfg) * 8);
          *puVar6 = *puVar6 & 0x80ff | ((short)((short)*pVVar5 << 1) >> 9 & 0x7fU) << 8;
          *puVar6 = *puVar6 & 0x7fff | (ushort)*pVVar5 & 0x8000;
          *puVar6 = *puVar6 & 0xff0f | ((ushort)*pVVar5 >> 4 & 7) << 4;
          *puVar7 = *puVar7 & 0xdfffffffffffffff | (ulong)((ushort)*pVVar5 & 1) << 0x3d;
          *puVar7 = *puVar7 & 0xbfffffffffffffff |
                    (long)(int)(uint)((short)((short)*pVVar5 << 1) >> 9 != 0) << 0x3e;
        }
      }
    }
    ctx_local._4_4_ = MPP_OK;
  }
  return ctx_local._4_4_;
}

Assistant:

static MPP_RET gen_vepu580_roi_h264(MppEncRoiImpl *ctx)
{
    RK_S32 mb_w = MPP_ALIGN(ctx->w, 16) / 16;
    RK_S32 mb_h = MPP_ALIGN(ctx->h, 16) / 16;
    RK_S32 stride_h = MPP_ALIGN(mb_w, 4);
    RK_S32 stride_v = MPP_ALIGN(mb_h, 4);
    RK_S32 roi_buf_size = stride_h * stride_v * 8;
    RK_S32 roi_qp_size = stride_h * stride_v * 2;

    Vepu541RoiCfg *src = (Vepu541RoiCfg *)ctx->tmp;
    Vepu580RoiQpCfg *dst_qp = ctx->dst_qp;
    Vepu580RoiH264BsCfg *dst_base = ctx->dst_base;
    RK_S32 j, k;

    if (!src || !dst_qp || !dst_base)
        return MPP_NOK;

    memset(dst_base, 0, roi_buf_size);
    memset(dst_qp, 0, roi_qp_size);

    for (j = 0; j < mb_h; j++) {
        for (k = 0; k < stride_h; k++) {
            if (ctx->cu_map[j * stride_h + k]) {
                Vepu541RoiCfg *cu_cfg = &src[j * stride_h + k];
                Vepu580RoiQpCfg *qp_cfg = &dst_qp[j * stride_h + k];
                Vepu580RoiH264BsCfg *base_cfg = &dst_base[j * stride_h + k];

                qp_cfg->qp_adj = cu_cfg->qp_adj;
                qp_cfg->qp_adj_mode = cu_cfg->qp_adj_mode;
                qp_cfg->qp_area_idx = cu_cfg->qp_area_idx;
                base_cfg->force_intra = cu_cfg->force_intra;
                base_cfg->qp_adj_en = !!cu_cfg->qp_adj;
#if 0
                if (j < 8 && k < 8) {
                    RK_U64 *tmp = (RK_U64 *)base_cfg;
                    RK_U16 *qp = (RK_U16 *)qp_cfg;

                    mpp_log("force_intra %d, qp_adj_en %d qp_adj %d, qp_adj_mode %d",
                            base_cfg->force_intra, base_cfg->qp_adj_en, qp_cfg->qp_adj, qp_cfg->qp_adj_mode);
                    mpp_log("val low %8x hight %8x", *tmp & 0xffffffff, ((*tmp >> 32) & 0xffffffff));

                    mpp_log("qp cfg %4x", *qp);
                }
#endif
            }
        }
    }

    return MPP_OK;
}